

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# damerau_levenshtein_distance.cc
# Opt level: O3

uint8_t absl::strings_internal::CappedDamerauLevenshteinDistance
                  (string_view s1,string_view s2,uint8_t cutoff)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  byte bVar5;
  byte bVar6;
  char *pcVar7;
  ulong uVar8;
  byte *pbVar9;
  long lVar10;
  long lVar11;
  byte bVar12;
  undefined7 in_register_00000081;
  ulong uVar13;
  ulong uVar14;
  byte *pbVar15;
  size_t j;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  int iVar20;
  undefined1 auVar19 [16];
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar32;
  int iVar37;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar38;
  int iVar40;
  undefined1 auVar39 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar43 [16];
  char acStack_29a2 [103];
  char acStack_293b [54];
  byte local_2905 [5];
  ulong local_2900;
  char *local_28f8;
  ulong local_28f0;
  ulong local_28e8;
  ulong local_28e0;
  byte local_28d5 [10405];
  
  pcVar7 = s2._M_str;
  uVar8 = s2._M_len;
  local_28e0 = s1._M_len;
  uVar14 = 100;
  if (cutoff < 100) {
    uVar14 = CONCAT71(in_register_00000081,cutoff) & 0xffffffff;
  }
  bVar5 = (byte)(uVar14 + 1);
  local_28f8 = s1._M_str;
  local_28e8 = uVar8;
  if (uVar8 < local_28e0) {
    local_28f8 = pcVar7;
    pcVar7 = s1._M_str;
    local_28e8 = local_28e0;
    local_28e0 = uVar8;
  }
  local_2900 = uVar14 & 0xff;
  bVar6 = bVar5;
  if ((local_28e8 < 0x65 && local_28e8 <= local_2900 + local_28e0) &&
     (bVar6 = (byte)local_28e8, local_28e0 != 0)) {
    auVar19._8_4_ = (int)local_2900;
    auVar19._0_8_ = local_2900;
    auVar19._12_4_ = 0;
    uVar8 = 0;
    auVar19 = auVar19 | _DAT_00161c80;
    do {
      auVar31._8_4_ = (int)uVar8;
      auVar31._0_8_ = uVar8;
      auVar31._12_4_ = (int)(uVar8 >> 0x20);
      auVar23 = (auVar31 | _DAT_00161c70) ^ _DAT_00161c80;
      iVar32 = auVar19._0_4_;
      iVar38 = -(uint)(iVar32 < auVar23._0_4_);
      iVar20 = auVar19._4_4_;
      auVar24._4_4_ = -(uint)(iVar20 < auVar23._4_4_);
      iVar37 = auVar19._8_4_;
      iVar40 = -(uint)(iVar37 < auVar23._8_4_);
      iVar21 = auVar19._12_4_;
      auVar24._12_4_ = -(uint)(iVar21 < auVar23._12_4_);
      auVar34._4_4_ = iVar38;
      auVar34._0_4_ = iVar38;
      auVar34._8_4_ = iVar40;
      auVar34._12_4_ = iVar40;
      auVar41 = pshuflw(in_XMM11,auVar34,0xe8);
      auVar26._4_4_ = -(uint)(auVar23._4_4_ == iVar20);
      auVar26._12_4_ = -(uint)(auVar23._12_4_ == iVar21);
      auVar26._0_4_ = auVar26._4_4_;
      auVar26._8_4_ = auVar26._12_4_;
      auVar43 = pshuflw(in_XMM12,auVar26,0xe8);
      auVar24._0_4_ = auVar24._4_4_;
      auVar24._8_4_ = auVar24._12_4_;
      auVar42 = pshuflw(auVar41,auVar24,0xe8);
      auVar23._8_4_ = 0xffffffff;
      auVar23._0_8_ = 0xffffffffffffffff;
      auVar23._12_4_ = 0xffffffff;
      auVar23 = (auVar42 | auVar43 & auVar41) ^ auVar23;
      auVar23 = packssdw(auVar23,auVar23);
      bVar12 = (byte)uVar8;
      if ((auVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_28d5[uVar8 + 1] = bVar12;
      }
      auVar24 = auVar26 & auVar34 | auVar24;
      auVar23 = packssdw(auVar24,auVar24);
      auVar42._8_4_ = 0xffffffff;
      auVar42._0_8_ = 0xffffffffffffffff;
      auVar42._12_4_ = 0xffffffff;
      auVar23 = packssdw(auVar23 ^ auVar42,auVar23 ^ auVar42);
      if ((auVar23._0_4_ >> 0x10 & 1) != 0) {
        local_28d5[uVar8 + 2] = bVar12 + 1;
      }
      auVar23 = (auVar31 | _DAT_00161c60) ^ _DAT_00161c80;
      iVar38 = -(uint)(iVar32 < auVar23._0_4_);
      auVar39._4_4_ = -(uint)(iVar20 < auVar23._4_4_);
      iVar40 = -(uint)(iVar37 < auVar23._8_4_);
      auVar39._12_4_ = -(uint)(iVar21 < auVar23._12_4_);
      auVar25._4_4_ = iVar38;
      auVar25._0_4_ = iVar38;
      auVar25._8_4_ = iVar40;
      auVar25._12_4_ = iVar40;
      auVar33._4_4_ = -(uint)(auVar23._4_4_ == iVar20);
      auVar33._12_4_ = -(uint)(auVar23._12_4_ == iVar21);
      auVar33._0_4_ = auVar33._4_4_;
      auVar33._8_4_ = auVar33._12_4_;
      auVar39._0_4_ = auVar39._4_4_;
      auVar39._8_4_ = auVar39._12_4_;
      auVar23 = auVar33 & auVar25 | auVar39;
      auVar23 = packssdw(auVar23,auVar23);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar23 = packssdw(auVar23 ^ auVar2,auVar23 ^ auVar2);
      if ((auVar23 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        local_28d5[uVar8 + 3] = bVar12 + 2;
      }
      auVar26 = pshufhw(auVar25,auVar25,0x84);
      auVar34 = pshufhw(auVar33,auVar33,0x84);
      auVar24 = pshufhw(auVar26,auVar39,0x84);
      auVar27._8_4_ = 0xffffffff;
      auVar27._0_8_ = 0xffffffffffffffff;
      auVar27._12_4_ = 0xffffffff;
      auVar27 = (auVar24 | auVar34 & auVar26) ^ auVar27;
      auVar26 = packssdw(auVar27,auVar27);
      if ((auVar26 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        local_28d5[uVar8 + 4] = bVar12 + 3;
      }
      auVar26 = (auVar31 | _DAT_00161c50) ^ _DAT_00161c80;
      iVar38 = -(uint)(iVar32 < auVar26._0_4_);
      auVar29._4_4_ = -(uint)(iVar20 < auVar26._4_4_);
      iVar40 = -(uint)(iVar37 < auVar26._8_4_);
      auVar29._12_4_ = -(uint)(iVar21 < auVar26._12_4_);
      auVar35._4_4_ = iVar38;
      auVar35._0_4_ = iVar38;
      auVar35._8_4_ = iVar40;
      auVar35._12_4_ = iVar40;
      auVar23 = pshuflw(auVar23,auVar35,0xe8);
      auVar28._4_4_ = -(uint)(auVar26._4_4_ == iVar20);
      auVar28._12_4_ = -(uint)(auVar26._12_4_ == iVar21);
      auVar28._0_4_ = auVar28._4_4_;
      auVar28._8_4_ = auVar28._12_4_;
      auVar26 = pshuflw(auVar43 & auVar41,auVar28,0xe8);
      in_XMM12 = auVar26 & auVar23;
      auVar29._0_4_ = auVar29._4_4_;
      auVar29._8_4_ = auVar29._12_4_;
      auVar23 = pshuflw(auVar23,auVar29,0xe8);
      auVar41._8_4_ = 0xffffffff;
      auVar41._0_8_ = 0xffffffffffffffff;
      auVar41._12_4_ = 0xffffffff;
      auVar41 = (auVar23 | in_XMM12) ^ auVar41;
      in_XMM11 = packssdw(auVar41,auVar41);
      if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_28d5[uVar8 + 5] = bVar12 + 4;
      }
      auVar29 = auVar28 & auVar35 | auVar29;
      auVar23 = packssdw(auVar29,auVar29);
      auVar43._8_4_ = 0xffffffff;
      auVar43._0_8_ = 0xffffffffffffffff;
      auVar43._12_4_ = 0xffffffff;
      auVar23 = packssdw(auVar23 ^ auVar43,auVar23 ^ auVar43);
      if ((auVar23 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        local_28d5[uVar8 + 6] = bVar12 + 5;
      }
      auVar23 = (auVar31 | _DAT_00161c40) ^ _DAT_00161c80;
      iVar32 = -(uint)(iVar32 < auVar23._0_4_);
      auVar36._4_4_ = -(uint)(iVar20 < auVar23._4_4_);
      iVar37 = -(uint)(iVar37 < auVar23._8_4_);
      auVar36._12_4_ = -(uint)(iVar21 < auVar23._12_4_);
      auVar30._4_4_ = iVar32;
      auVar30._0_4_ = iVar32;
      auVar30._8_4_ = iVar37;
      auVar30._12_4_ = iVar37;
      auVar22._4_4_ = -(uint)(auVar23._4_4_ == iVar20);
      auVar22._12_4_ = -(uint)(auVar23._12_4_ == iVar21);
      auVar22._0_4_ = auVar22._4_4_;
      auVar22._8_4_ = auVar22._12_4_;
      auVar36._0_4_ = auVar36._4_4_;
      auVar36._8_4_ = auVar36._12_4_;
      auVar23 = auVar22 & auVar30 | auVar36;
      auVar23 = packssdw(auVar23,auVar23);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar23 = packssdw(auVar23 ^ auVar3,auVar23 ^ auVar3);
      if ((auVar23 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        local_28d5[uVar8 + 7] = bVar12 + 6;
      }
      auVar31 = pshufhw(auVar30,auVar30,0x84);
      auVar23 = pshufhw(auVar22,auVar22,0x84);
      auVar26 = pshufhw(auVar31,auVar36,0x84);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar23 = packssdw(auVar23 & auVar31,(auVar26 | auVar23 & auVar31) ^ auVar4);
      if ((auVar23 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        local_28d5[uVar8 + 8] = bVar12 + 7;
      }
      uVar8 = uVar8 + 8;
    } while (((int)local_2900 + 8U & 0xf8) != uVar8);
    local_28d5[uVar14 + 2] = bVar5;
    local_28f0 = (ulong)(byte)(((char)local_28e0 - bVar6) + (char)uVar14);
    uVar8 = 1;
    do {
      uVar17 = local_28e8;
      lVar10 = uVar8 * 0x66;
      pbVar9 = local_28d5 + lVar10 + 1;
      uVar16 = uVar8 - local_28f0;
      if (uVar8 < local_28f0 || uVar16 == 0) {
        *pbVar9 = (byte)uVar8;
        uVar16 = 1;
      }
      else {
        pbVar9[uVar16 - 1] = bVar5;
      }
      uVar13 = uVar8 + local_2900;
      if (uVar13 <= uVar17) {
        pbVar9[uVar13 + 1] = bVar5;
        uVar17 = uVar13;
      }
      if (uVar16 <= uVar17) {
        cVar1 = local_28f8[uVar8 - 1];
        do {
          local_2905[4] = bVar5;
          if ((((1 < uVar8) && (1 < uVar16)) && (cVar1 == pcVar7[uVar16 - 2])) &&
             (local_28f8[uVar8 - 2] == pcVar7[uVar16 - 1])) {
            local_2905[4] = acStack_29a2[uVar16 + lVar10] + 1;
          }
          local_2905[0] = bVar5;
          local_2905[1] = acStack_293b[uVar16 + lVar10 + 1] + '\x01';
          local_2905[2] = local_28d5[uVar16 + lVar10] + 1;
          local_2905[3] = (cVar1 != pcVar7[uVar16 - 1]) + acStack_293b[uVar16 + lVar10];
          lVar11 = 1;
          uVar13 = uVar14 + 1 & 0xffffffff;
          pbVar15 = local_2905;
          do {
            bVar6 = local_2905[lVar11];
            bVar12 = (byte)uVar13;
            uVar13 = uVar13 & 0xff;
            if (bVar6 < bVar12) {
              pbVar15 = local_2905 + lVar11;
              uVar13 = (ulong)bVar6;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != 5);
          pbVar9[uVar16] = *pbVar15;
          uVar16 = uVar16 + 1;
        } while (uVar16 <= uVar17);
      }
      bVar18 = uVar8 < local_28e0;
      uVar8 = uVar8 + 1;
    } while (bVar18);
    bVar6 = local_28d5[local_28e8 + local_28e0 * 0x66 + 1];
  }
  return bVar6;
}

Assistant:

uint8_t CappedDamerauLevenshteinDistance(absl::string_view s1,
                                         absl::string_view s2, uint8_t cutoff) {
  const uint8_t MAX_SIZE = 100;
  const uint8_t _cutoff = std::min(MAX_SIZE, cutoff);
  const uint8_t cutoff_plus_1 = static_cast<uint8_t>(_cutoff + 1);

  if (s1.size() > s2.size()) std::swap(s1, s2);
  if (s1.size() + _cutoff < s2.size() || s2.size() > MAX_SIZE)
    return cutoff_plus_1;

  if (s1.empty())
    return static_cast<uint8_t>(s2.size());

  // Lower diagonal bound: y = x - lower_diag
  const uint8_t lower_diag =
      _cutoff - static_cast<uint8_t>(s2.size() - s1.size());
  // Upper diagonal bound: y = x + upper_diag
  const uint8_t upper_diag = _cutoff;

  // d[i][j] is the number of edits required to convert s1[0, i] to s2[0, j]
  std::array<std::array<uint8_t, MAX_SIZE + 2>, MAX_SIZE + 2> d;
  std::iota(d[0].begin(), d[0].begin() + upper_diag + 1, 0);
  d[0][cutoff_plus_1] = cutoff_plus_1;
  for (size_t i = 1; i <= s1.size(); ++i) {
    // Deduce begin of relevant window.
    size_t j_begin = 1;
    if (i > lower_diag) {
      j_begin = i - lower_diag;
      d[i][j_begin - 1] = cutoff_plus_1;
    } else {
      d[i][0] = static_cast<uint8_t>(i);
    }

    // Deduce end of relevant window.
    size_t j_end = i + upper_diag;
    if (j_end > s2.size()) {
      j_end = s2.size();
    } else {
      d[i][j_end + 1] = cutoff_plus_1;
    }

    for (size_t j = j_begin; j <= j_end; ++j) {
      const uint8_t deletion_distance = d[i - 1][j] + 1;
      const uint8_t insertion_distance = d[i][j - 1] + 1;
      const uint8_t mismatched_tail_cost = s1[i - 1] == s2[j - 1] ? 0 : 1;
      const uint8_t mismatch_distance = d[i - 1][j - 1] + mismatched_tail_cost;
      uint8_t transposition_distance = _cutoff + 1;
      if (i > 1 && j > 1 && s1[i - 1] == s2[j - 2] && s1[i - 2] == s2[j - 1])
        transposition_distance = d[i - 2][j - 2] + 1;
      d[i][j] = std::min({cutoff_plus_1, deletion_distance, insertion_distance,
                          mismatch_distance, transposition_distance});
    }
  }
  return d[s1.size()][s2.size()];
}